

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error entityValueProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  ENCODING *enc;
  int iVar1;
  XML_Error XVar2;
  char *next;
  char *local_38;
  
  enc = parser->m_encoding;
  local_38 = s;
  iVar1 = (*enc->scanners[0])(enc,s,end,&local_38);
  while (0 < iVar1) {
    iVar1 = (*enc->scanners[0])(enc,local_38,end,&local_38);
  }
  if ((iVar1 == 0) || ((parser->m_parsingStatus).finalBuffer != '\0')) {
    if (iVar1 + 2U < 3) {
      XVar2 = XML_ERROR_INVALID_TOKEN - iVar1;
    }
    else {
      XVar2 = storeEntityValue(parser,enc,s,end,XML_ACCOUNT_DIRECT);
    }
  }
  else {
    *nextPtr = s;
    XVar2 = XML_ERROR_NONE;
  }
  return XVar2;
}

Assistant:

static enum XML_Error PTRCALL
entityValueProcessor(XML_Parser parser, const char *s, const char *end,
                     const char **nextPtr) {
  const char *start = s;
  const char *next = s;
  const ENCODING *enc = parser->m_encoding;
  int tok;

  for (;;) {
    tok = XmlPrologTok(enc, start, end, &next);
    /* Note: These bytes are accounted later in:
             - storeEntityValue
    */
    if (tok <= 0) {
      if (! parser->m_parsingStatus.finalBuffer && tok != XML_TOK_INVALID) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      switch (tok) {
      case XML_TOK_INVALID:
        return XML_ERROR_INVALID_TOKEN;
      case XML_TOK_PARTIAL:
        return XML_ERROR_UNCLOSED_TOKEN;
      case XML_TOK_PARTIAL_CHAR:
        return XML_ERROR_PARTIAL_CHAR;
      case XML_TOK_NONE: /* start == end */
      default:
        break;
      }
      /* found end of entity value - can store it now */
      return storeEntityValue(parser, enc, s, end, XML_ACCOUNT_DIRECT);
    }
    start = next;
  }
}